

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnan.h
# Opt level: O0

bool is_qnan(float in)

{
  bool local_11;
  _IEEESingle temp;
  float in_local;
  
  local_11 = ((uint)in >> 0x17 & 0xff) == 0xff && ((uint)in & 0x7fffff) != 0;
  return local_11;
}

Assistant:

AI_FORCE_INLINE bool is_qnan(float in) {
    // the straightforward solution does not work:
    //   return (in != in);
    // compiler generates code like this
    //   load <in> to <register-with-different-width>
    //   compare <register-with-different-width> against <in>

    // FIXME: Use <float> stuff instead? I think fpclassify needs C99
    _IEEESingle temp;
    memcpy(&temp, &in, sizeof(float));
    return (temp.IEEE.Exp == (1u << 8)-1 &&
        temp.IEEE.Frac);
}